

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O1

void __thiscall MarkerIndex::Iterator::Iterator(Iterator *this,MarkerIndex *marker_index)

{
  this->marker_index = marker_index;
  this->current_node = (Node *)0x0;
  Point::Point(&this->current_node_position);
  Point::Point(&this->left_ancestor_position);
  Point::Point(&this->right_ancestor_position);
  (this->right_ancestor_position_stack).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->right_ancestor_position_stack).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->left_ancestor_position_stack).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->right_ancestor_position_stack).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->left_ancestor_position_stack).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->left_ancestor_position_stack).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

MarkerIndex::Iterator::Iterator(MarkerIndex *marker_index) :
  marker_index{marker_index},
  current_node{nullptr} {}